

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O3

float tinyusdz::detail::Rec709ToLinear(uint8_t v)

{
  undefined3 in_register_00000039;
  float fVar1;
  
  fVar1 = (float)CONCAT31(in_register_00000039,v) / 255.0;
  if (0.081 < fVar1) {
    return fVar1 / 4.5;
  }
  fVar1 = powf((fVar1 + 0.099) / 1.099,2.2222223);
  return fVar1;
}

Assistant:

float Rec709ToLinear(uint8_t v) {
  float V = v / 255.0f;

  float L;
  if (V > 0.081f) {
    L = V / 4.5f;
  } else {
    L = std::pow((V + 0.099f)/1.099f, (1.0f/0.45f));
  }

  return L;

}